

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_Tan(FParser *this)

{
  bool bVar1;
  double dVar2;
  
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    dVar2 = floatvalue(this->t_argv);
    dVar2 = c_tan(dVar2);
    (this->t_return).value.i = (int)(dVar2 * 65536.0);
    (this->t_return).type = 6;
  }
  return;
}

Assistant:

void FParser::SF_Tan()
{
	if (CheckArgs(1))
	{
		t_return.setDouble(g_tan(floatvalue(t_argv[0])));
	}
}